

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O0

bool operator==(ON_String *lhs,char *rhs)

{
  int element_count1;
  int iVar1;
  char *string1;
  undefined1 local_1d;
  int length;
  char *rhs_local;
  ON_String *lhs_local;
  
  element_count1 = ON_String::Length(lhs);
  iVar1 = ON_String::Length(rhs);
  local_1d = false;
  if (element_count1 == iVar1) {
    string1 = ON_String::operator_cast_to_char_(lhs);
    local_1d = ON_String::EqualOrdinal(string1,element_count1,rhs,element_count1,false);
  }
  return local_1d;
}

Assistant:

bool operator==( const ON_String& lhs, const char* rhs )
{
  const int length = lhs.Length();

  return (length == ON_String::Length(rhs))
    && ON_String::EqualOrdinal(
    static_cast<const char*>(lhs),
    length,
    rhs,
    length,
    false
    );
}